

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O3

Info * re2::Prefilter::Info::Concat(Info *a,Info *b)

{
  _Rb_tree_header *p_Var1;
  Info *this;
  _Rb_tree_header *p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (a != (Info *)0x0) {
    if (a->is_exact_ == false) {
      __assert_fail("a->is_exact_",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prefilter.cc"
                    ,0x130,"static Prefilter::Info *re2::Prefilter::Info::Concat(Info *, Info *)");
    }
    if ((b == (Info *)0x0) || (b->is_exact_ == false)) {
      __assert_fail("b && b->is_exact_",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prefilter.cc"
                    ,0x131,"static Prefilter::Info *re2::Prefilter::Info::Concat(Info *, Info *)");
    }
    this = (Info *)operator_new(0x40);
    p_Var2 = &(this->exact_)._M_t._M_impl.super__Rb_tree_header;
    (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this->is_exact_ = false;
    this->match_ = (Prefilter *)0x0;
    local_70 = (a->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(a->exact_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_70 != p_Var2) {
      p_Var1 = &(b->exact_)._M_t._M_impl.super__Rb_tree_header;
      do {
        p_Var3 = (b->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)p_Var3 != p_Var1) {
          do {
            std::operator+(&local_50,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_70 + 1),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var3 + 1));
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)this,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
          } while ((_Rb_tree_header *)p_Var3 != p_Var1);
        }
        local_70 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_70);
      } while ((_Rb_tree_header *)local_70 != p_Var2);
    }
    this->is_exact_ = true;
    ~Info(a);
    operator_delete(a);
    ~Info(b);
    operator_delete(b);
    b = this;
  }
  return b;
}

Assistant:

Prefilter::Info* Prefilter::Info::Concat(Info* a, Info* b) {
  if (a == NULL)
    return b;
  DCHECK(a->is_exact_);
  DCHECK(b && b->is_exact_);
  Info *ab = new Info();

  CrossProduct(a->exact_, b->exact_, &ab->exact_);
  ab->is_exact_ = true;

  delete a;
  delete b;
  return ab;
}